

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O0

DdNode * cuddZddIsop(DdManager *dd,DdNode *L,DdNode *U,DdNode **zdd_I)

{
  long lVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *n_00;
  DdManager *n_01;
  int local_14c;
  DD_CTFP cacheOp;
  DdNode *pDStack_138;
  int index;
  DdNode *z;
  DdNode *y;
  DdNode *r;
  DdNode *Unv;
  DdNode *Lnv;
  DdNode *Uv;
  DdNode *Lv;
  DdNode *sum;
  DdNode *term1;
  DdNode *term0;
  DdNode *x;
  DdNode *zdd_Id;
  DdNode *zdd_Isub1;
  DdNode *zdd_Isub0;
  DdNode *Id;
  DdNode *Isub1;
  DdNode *Isub0;
  DdNode *Usuper1;
  DdNode *Lsuper1;
  DdNode *Usuper0;
  DdNode *Lsuper0;
  DdNode *Ud;
  DdNode *Ld;
  DdNode *Usub1;
  DdNode *Lsub1;
  DdNode *Usub0;
  DdNode *Lsub0;
  int local_58;
  int top_u;
  int top_l;
  int v;
  DdNode *zdd_zero;
  DdNode *zdd_one;
  DdNode *zero;
  DdNode *one;
  DdNode **zdd_I_local;
  DdNode *U_local;
  DdNode *L_local;
  DdManager *dd_local;
  
  zero = dd->one;
  zdd_one = (DdNode *)((ulong)zero ^ 1);
  zdd_zero = dd->one;
  _top_l = dd->zero;
  if (L == zdd_one) {
    *zdd_I = _top_l;
    dd_local = (DdManager *)zdd_one;
  }
  else if (U == zero) {
    *zdd_I = zdd_zero;
    dd_local = (DdManager *)zero;
  }
  else {
    one = (DdNode *)zdd_I;
    zdd_I_local = (DdNode **)U;
    U_local = L;
    L_local = &dd->sentinel;
    if ((U == zdd_one) || (L == zero)) {
      printf("*** ERROR : illegal condition for ISOP (U < L).\n");
      exit(1);
    }
    pDVar2 = cuddCacheLookup2(dd,cuddBddIsop,L,U);
    if (pDVar2 != (DdNode *)0x0) {
      pDVar3 = cuddCacheLookup2Zdd((DdManager *)L_local,cuddZddIsop,U_local,(DdNode *)zdd_I_local);
      *(DdNode **)one = pDVar3;
      lVar1._0_4_ = one->index;
      lVar1._4_4_ = one->ref;
      if (lVar1 != 0) {
        return pDVar2;
      }
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref((DdManager *)L_local,pDVar2);
    }
    local_58 = *(int *)(L_local[7].Id + (ulong)*(uint *)((ulong)U_local & 0xfffffffffffffffe) * 4);
    Lsub0._4_4_ = *(int *)(L_local[7].Id +
                          (ulong)*(uint *)((ulong)zdd_I_local & 0xfffffffffffffffe) * 4);
    local_14c = local_58;
    if (Lsub0._4_4_ < local_58) {
      local_14c = Lsub0._4_4_;
    }
    top_u = local_14c;
    if (local_58 == local_14c) {
      cacheOp._4_4_ = *(int *)((ulong)U_local & 0xfffffffffffffffe);
      Uv = *(DdNode **)(((ulong)U_local & 0xfffffffffffffffe) + 0x10);
      Unv = *(DdNode **)(((ulong)U_local & 0xfffffffffffffffe) + 0x18);
      if (((ulong)U_local & 1) != 0) {
        Uv = (DdNode *)((ulong)Uv ^ 1);
        Unv = (DdNode *)((ulong)Unv ^ 1);
      }
    }
    else {
      cacheOp._4_4_ = *(int *)((ulong)zdd_I_local & 0xfffffffffffffffe);
      Unv = U_local;
      Uv = U_local;
    }
    if (Lsub0._4_4_ == local_14c) {
      Lnv = *(DdNode **)(((ulong)zdd_I_local & 0xfffffffffffffffe) + 0x10);
      r = *(DdNode **)(((ulong)zdd_I_local & 0xfffffffffffffffe) + 0x18);
      if (((ulong)zdd_I_local & 1) != 0) {
        Lnv = (DdNode *)((ulong)Lnv ^ 1);
        r = (DdNode *)((ulong)r ^ 1);
      }
    }
    else {
      r = (DdNode *)zdd_I_local;
      Lnv = (DdNode *)zdd_I_local;
    }
    Usub0 = cuddBddAndRecur((DdManager *)L_local,Unv,(DdNode *)((ulong)Lnv ^ 1));
    if (Usub0 == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      Cudd_Ref(Usub0);
      Lsub1 = r;
      Usub1 = cuddBddAndRecur((DdManager *)L_local,Uv,(DdNode *)((ulong)r ^ 1));
      if (Usub1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(Usub1);
        Ld = Lnv;
        Isub1 = cuddZddIsop((DdManager *)L_local,Usub0,Lsub1,&zdd_Isub1);
        if (Isub1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
          Cudd_RecursiveDeref((DdManager *)L_local,Usub1);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(Isub1);
          Cudd_Ref(zdd_Isub1);
          Id = cuddZddIsop((DdManager *)L_local,Usub1,Ld,&zdd_Id);
          if (Id == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
            Cudd_RecursiveDeref((DdManager *)L_local,Usub1);
            Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
            Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(Id);
            Cudd_Ref(zdd_Id);
            Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
            Cudd_RecursiveDeref((DdManager *)L_local,Usub1);
            Usuper0 = cuddBddAndRecur((DdManager *)L_local,Unv,(DdNode *)((ulong)Isub1 ^ 1));
            if (Usuper0 == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
              Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
              Cudd_RecursiveDeref((DdManager *)L_local,Id);
              Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
              dd_local = (DdManager *)0x0;
            }
            else {
              Cudd_Ref(Usuper0);
              Usuper1 = cuddBddAndRecur((DdManager *)L_local,Uv,(DdNode *)((ulong)Id ^ 1));
              if (Usuper1 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                Cudd_RecursiveDeref((DdManager *)L_local,Id);
                Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                dd_local = (DdManager *)0x0;
              }
              else {
                Cudd_Ref(Usuper1);
                Lsuper1 = r;
                Isub0 = Lnv;
                Ud = cuddBddAndRecur((DdManager *)L_local,(DdNode *)((ulong)Usuper0 ^ 1),
                                     (DdNode *)((ulong)Usuper1 ^ 1));
                if (Ud == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                  Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                  Cudd_RecursiveDeref((DdManager *)L_local,Id);
                  Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                  Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                  Cudd_RecursiveDeref((DdManager *)L_local,Usuper1);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  Ud = (DdNode *)((ulong)Ud ^ 1);
                  Cudd_Ref(Ud);
                  Lsuper0 = cuddBddAndRecur((DdManager *)L_local,Lsuper1,Isub0);
                  if (Lsuper0 == (DdNode *)0x0) {
                    Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                    Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                    Cudd_RecursiveDeref((DdManager *)L_local,Id);
                    Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                    Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                    Cudd_RecursiveDeref((DdManager *)L_local,Usuper1);
                    Cudd_RecursiveDeref((DdManager *)L_local,Ud);
                    dd_local = (DdManager *)0x0;
                  }
                  else {
                    Cudd_Ref(Lsuper0);
                    Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                    Cudd_RecursiveDeref((DdManager *)L_local,Usuper1);
                    zdd_Isub0 = cuddZddIsop((DdManager *)L_local,Ud,Lsuper0,&x);
                    if (zdd_Isub0 == (DdNode *)0x0) {
                      Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                      Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                      Cudd_RecursiveDeref((DdManager *)L_local,Id);
                      Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                      Cudd_RecursiveDeref((DdManager *)L_local,Ud);
                      Cudd_RecursiveDeref((DdManager *)L_local,Lsuper0);
                      dd_local = (DdManager *)0x0;
                    }
                    else {
                      Cudd_Ref(zdd_Isub0);
                      Cudd_Ref(x);
                      Cudd_RecursiveDeref((DdManager *)L_local,Ud);
                      Cudd_RecursiveDeref((DdManager *)L_local,Lsuper0);
                      pDVar2 = cuddUniqueInter((DdManager *)L_local,cacheOp._4_4_,zero,zdd_one);
                      if (pDVar2 == (DdNode *)0x0) {
                        Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                        Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                        Cudd_RecursiveDeref((DdManager *)L_local,Id);
                        Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                        Cudd_RecursiveDeref((DdManager *)L_local,zdd_Isub0);
                        Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                        dd_local = (DdManager *)0x0;
                      }
                      else {
                        Cudd_Ref(pDVar2);
                        pDVar3 = cuddBddAndRecur((DdManager *)L_local,(DdNode *)((ulong)pDVar2 ^ 1),
                                                 Isub1);
                        if (pDVar3 == (DdNode *)0x0) {
                          Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                          Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                          Cudd_RecursiveDeref((DdManager *)L_local,Id);
                          Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                          Cudd_RecursiveDeref((DdManager *)L_local,zdd_Isub0);
                          Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                          Cudd_RecursiveDeref((DdManager *)L_local,pDVar2);
                          dd_local = (DdManager *)0x0;
                        }
                        else {
                          Cudd_Ref(pDVar3);
                          Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                          n = cuddBddAndRecur((DdManager *)L_local,pDVar2,Id);
                          if (n == (DdNode *)0x0) {
                            Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                            Cudd_RecursiveDeref((DdManager *)L_local,Id);
                            Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                            Cudd_RecursiveDeref((DdManager *)L_local,zdd_Isub0);
                            Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                            Cudd_RecursiveDeref((DdManager *)L_local,pDVar2);
                            Cudd_RecursiveDeref((DdManager *)L_local,pDVar3);
                            dd_local = (DdManager *)0x0;
                          }
                          else {
                            Cudd_Ref(n);
                            Cudd_RecursiveDeref((DdManager *)L_local,pDVar2);
                            Cudd_RecursiveDeref((DdManager *)L_local,Id);
                            pDVar2 = cuddBddAndRecur((DdManager *)L_local,
                                                     (DdNode *)((ulong)pDVar3 ^ 1),
                                                     (DdNode *)((ulong)n ^ 1));
                            if (pDVar2 == (DdNode *)0x0) {
                              Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                              Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                              Cudd_RecursiveDeref((DdManager *)L_local,zdd_Isub0);
                              Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                              Cudd_RecursiveDeref((DdManager *)L_local,pDVar3);
                              Cudd_RecursiveDeref((DdManager *)L_local,n);
                              dd_local = (DdManager *)0x0;
                            }
                            else {
                              n_00 = (DdNode *)((ulong)pDVar2 ^ 1);
                              Cudd_Ref(n_00);
                              Cudd_RecursiveDeref((DdManager *)L_local,pDVar3);
                              Cudd_RecursiveDeref((DdManager *)L_local,n);
                              pDVar2 = cuddBddAndRecur((DdManager *)L_local,pDVar2,
                                                       (DdNode *)((ulong)zdd_Isub0 ^ 1));
                              n_01 = (DdManager *)
                                     ((ulong)pDVar2 ^ (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
                              if (n_01 == (DdManager *)0x0) {
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                                Cudd_RecursiveDeref((DdManager *)L_local,zdd_Isub0);
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                                Cudd_RecursiveDeref((DdManager *)L_local,n_00);
                                dd_local = (DdManager *)0x0;
                              }
                              else {
                                Cudd_Ref((DdNode *)n_01);
                                Cudd_RecursiveDeref((DdManager *)L_local,n_00);
                                Cudd_RecursiveDeref((DdManager *)L_local,zdd_Isub0);
                                if (zdd_Isub1 == _top_l) {
                                  pDStack_138 = x;
                                }
                                else {
                                  pDStack_138 = cuddZddGetNodeIVO((DdManager *)L_local,
                                                                  cacheOp._4_4_ * 2 + 1,zdd_Isub1,x)
                                  ;
                                  if (pDStack_138 == (DdNode *)0x0) {
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                                    Cudd_RecursiveDeref((DdManager *)L_local,(DdNode *)n_01);
                                    return (DdNode *)0x0;
                                  }
                                }
                                Cudd_Ref(pDStack_138);
                                if (zdd_Id == _top_l) {
                                  z = pDStack_138;
                                }
                                else {
                                  z = cuddZddGetNodeIVO((DdManager *)L_local,cacheOp._4_4_ << 1,
                                                        zdd_Id,pDStack_138);
                                  if (z == (DdNode *)0x0) {
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                                    Cudd_RecursiveDeref((DdManager *)L_local,(DdNode *)n_01);
                                    Cudd_RecursiveDerefZdd((DdManager *)L_local,pDStack_138);
                                    return (DdNode *)0x0;
                                  }
                                }
                                Cudd_Ref(z);
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Isub1);
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,zdd_Id);
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,x);
                                Cudd_RecursiveDerefZdd((DdManager *)L_local,pDStack_138);
                                cuddCacheInsert2((DdManager *)L_local,cuddBddIsop,U_local,
                                                 (DdNode *)zdd_I_local,(DdNode *)n_01);
                                cuddCacheInsert2((DdManager *)L_local,cuddZddIsop,U_local,
                                                 (DdNode *)zdd_I_local,z);
                                Cudd_Deref((DdNode *)n_01);
                                Cudd_Deref(z);
                                *(DdNode **)one = z;
                                dd_local = n_01;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddIsop(
  DdManager * dd,
  DdNode * L,
  DdNode * U,
  DdNode ** zdd_I)
{
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = Cudd_Not(one);
    DdNode      *zdd_one = DD_ONE(dd);
    DdNode      *zdd_zero = DD_ZERO(dd);
    int         v, top_l, top_u;
    DdNode      *Lsub0, *Usub0, *Lsub1, *Usub1, *Ld, *Ud;
    DdNode      *Lsuper0, *Usuper0, *Lsuper1, *Usuper1;
    DdNode      *Isub0, *Isub1, *Id;
    DdNode      *zdd_Isub0, *zdd_Isub1, *zdd_Id;
    DdNode      *x;
    DdNode      *term0, *term1, *sum;
    DdNode      *Lv, *Uv, *Lnv, *Unv;
    DdNode      *r, *y, *z;
    int         index;
    DD_CTFP     cacheOp;

    statLine(dd);
    if (L == zero) {
        *zdd_I = zdd_zero;
        return(zero);
    }
    if (U == one) {
        *zdd_I = zdd_one;
        return(one);
    }

    if (U == zero || L == one) {
        printf("*** ERROR : illegal condition for ISOP (U < L).\n");
        exit(1);
    }

    /* Check the cache. We store two results for each recursive call.
    ** One is the BDD, and the other is the ZDD. Both are needed.
    ** Hence we need a double hit in the cache to terminate the
    ** recursion. Clearly, collisions may evict only one of the two
    ** results. */
    cacheOp = (DD_CTFP) cuddZddIsop;
    r = cuddCacheLookup2(dd, cuddBddIsop, L, U);
    if (r) {
        *zdd_I = cuddCacheLookup2Zdd(dd, cacheOp, L, U);
        if (*zdd_I)
            return(r);
        else {
            /* The BDD result may have been dead. In that case
            ** cuddCacheLookup2 would have called cuddReclaim,
            ** whose effects we now have to undo. */
            cuddRef(r);
            Cudd_RecursiveDeref(dd, r);
        }
    }

    top_l = dd->perm[Cudd_Regular(L)->index];
    top_u = dd->perm[Cudd_Regular(U)->index];
    v = ddMin(top_l, top_u);

    /* Compute cofactors. */
    if (top_l == v) {
        index = Cudd_Regular(L)->index;
        Lv = Cudd_T(L);
        Lnv = Cudd_E(L);
        if (Cudd_IsComplement(L)) {
            Lv = Cudd_Not(Lv);
            Lnv = Cudd_Not(Lnv);
        }
    }
    else {
        index = Cudd_Regular(U)->index;
        Lv = Lnv = L;
    }

    if (top_u == v) {
        Uv = Cudd_T(U);
        Unv = Cudd_E(U);
        if (Cudd_IsComplement(U)) {
            Uv = Cudd_Not(Uv);
            Unv = Cudd_Not(Unv);
        }
    }
    else {
        Uv = Unv = U;
    }

    Lsub0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Uv));
    if (Lsub0 == NULL)
        return(NULL);
    Cudd_Ref(Lsub0);
    Usub0 = Unv;
    Lsub1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Unv));
    if (Lsub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        return(NULL);
    }
    Cudd_Ref(Lsub1);
    Usub1 = Uv;

    Isub0 = cuddZddIsop(dd, Lsub0, Usub0, &zdd_Isub0);
    if (Isub0 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        return(NULL);
    }
    /*
    if ((!cuddIsConstant(Cudd_Regular(Isub0))) &&
        (Cudd_Regular(Isub0)->index != zdd_Isub0->index / 2 ||
        dd->permZ[index * 2] > dd->permZ[zdd_Isub0->index])) {
        printf("*** ERROR : illegal permutation in ZDD. ***\n");
    }
    */
    Cudd_Ref(Isub0);
    Cudd_Ref(zdd_Isub0);
    Isub1 = cuddZddIsop(dd, Lsub1, Usub1, &zdd_Isub1);
    if (Isub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        return(NULL);
    }
    /*
    if ((!cuddIsConstant(Cudd_Regular(Isub1))) &&
        (Cudd_Regular(Isub1)->index != zdd_Isub1->index / 2 ||
        dd->permZ[index * 2] > dd->permZ[zdd_Isub1->index])) {
        printf("*** ERROR : illegal permutation in ZDD. ***\n");
    }
    */
    Cudd_Ref(Isub1);
    Cudd_Ref(zdd_Isub1);
    Cudd_RecursiveDeref(dd, Lsub0);
    Cudd_RecursiveDeref(dd, Lsub1);

    Lsuper0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Isub0));
    if (Lsuper0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        return(NULL);
    }
    Cudd_Ref(Lsuper0);
    Lsuper1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Isub1));
    if (Lsuper1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        return(NULL);
    }
    Cudd_Ref(Lsuper1);
    Usuper0 = Unv;
    Usuper1 = Uv;

    /* Ld = Lsuper0 + Lsuper1 */
    Ld = cuddBddAndRecur(dd, Cudd_Not(Lsuper0), Cudd_Not(Lsuper1));
    if (Ld == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        return(NULL);
    }
    Ld = Cudd_Not(Ld);
    Cudd_Ref(Ld);
    /* Ud = Usuper0 * Usuper1 */
    Ud = cuddBddAndRecur(dd, Usuper0, Usuper1);
    if (Ud == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        Cudd_RecursiveDeref(dd, Ld);
        return(NULL);
    }
    Cudd_Ref(Ud);
    Cudd_RecursiveDeref(dd, Lsuper0);
    Cudd_RecursiveDeref(dd, Lsuper1);

    Id = cuddZddIsop(dd, Ld, Ud, &zdd_Id);
    if (Id == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Ld);
        Cudd_RecursiveDeref(dd, Ud);
        return(NULL);
    }
    /*
    if ((!cuddIsConstant(Cudd_Regular(Id))) &&
        (Cudd_Regular(Id)->index != zdd_Id->index / 2 ||
        dd->permZ[index * 2] > dd->permZ[zdd_Id->index])) {
        printf("*** ERROR : illegal permutation in ZDD. ***\n");
    }
    */
    Cudd_Ref(Id);
    Cudd_Ref(zdd_Id);
    Cudd_RecursiveDeref(dd, Ld);
    Cudd_RecursiveDeref(dd, Ud);

    x = cuddUniqueInter(dd, index, one, zero);
    if (x == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        return(NULL);
    }
    Cudd_Ref(x);
    /* term0 = x * Isub0 */
    term0 = cuddBddAndRecur(dd, Cudd_Not(x), Isub0);
    if (term0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, x);
        return(NULL);
    }
    Cudd_Ref(term0);
    Cudd_RecursiveDeref(dd, Isub0);
    /* term1 = x * Isub1 */
    term1 = cuddBddAndRecur(dd, x, Isub1);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, x);
        Cudd_RecursiveDeref(dd, term0);
        return(NULL);
    }
    Cudd_Ref(term1);
    Cudd_RecursiveDeref(dd, x);
    Cudd_RecursiveDeref(dd, Isub1);
    /* sum = term0 + term1 */
    sum = cuddBddAndRecur(dd, Cudd_Not(term0), Cudd_Not(term1));
    if (sum == NULL) {
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, term0);
        Cudd_RecursiveDeref(dd, term1);
        return(NULL);
    }
    sum = Cudd_Not(sum);
    Cudd_Ref(sum);
    Cudd_RecursiveDeref(dd, term0);
    Cudd_RecursiveDeref(dd, term1);
    /* r = sum + Id */
    r = cuddBddAndRecur(dd, Cudd_Not(sum), Cudd_Not(Id));
    r = Cudd_NotCond(r, r != NULL);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, sum);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDeref(dd, sum);
    Cudd_RecursiveDeref(dd, Id);

    if (zdd_Isub0 != zdd_zero) {
        z = cuddZddGetNodeIVO(dd, index * 2 + 1, zdd_Isub0, zdd_Id);
        if (z == NULL) {
            Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
            Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
            Cudd_RecursiveDerefZdd(dd, zdd_Id);
            Cudd_RecursiveDeref(dd, r);
            return(NULL);
        }
    }
    else {
        z = zdd_Id;
    }
    Cudd_Ref(z);
    if (zdd_Isub1 != zdd_zero) {
        y = cuddZddGetNodeIVO(dd, index * 2, zdd_Isub1, z);
        if (y == NULL) {
            Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
            Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
            Cudd_RecursiveDerefZdd(dd, zdd_Id);
            Cudd_RecursiveDeref(dd, r);
            Cudd_RecursiveDerefZdd(dd, z);
            return(NULL);
        }
    }
    else
        y = z;
    Cudd_Ref(y);

    Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
    Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
    Cudd_RecursiveDerefZdd(dd, zdd_Id);
    Cudd_RecursiveDerefZdd(dd, z);

    cuddCacheInsert2(dd, cuddBddIsop, L, U, r);
    cuddCacheInsert2(dd, cacheOp, L, U, y);

    Cudd_Deref(r);
    Cudd_Deref(y);
    *zdd_I = y;
    /*
    if (Cudd_Regular(r)->index != y->index / 2) {
        printf("*** ERROR : mismatch in indices between BDD and ZDD. ***\n");
    }
    */
    return(r);

}